

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryPropertyDescriptor.h
# Opt level: O2

void __thiscall
Js::DictionaryPropertyDescriptor<unsigned_short>::AddShadowedData
          (DictionaryPropertyDescriptor<unsigned_short> *this,unsigned_short *nextPropertyIndex,
          bool addingLetConstGlobal)

{
  code *pcVar1;
  bool bVar2;
  Flags FVar3;
  unsigned_short uVar4;
  undefined4 *puVar5;
  
  FVar3 = this->flags;
  if ((FVar3 & IsShadowed) != None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                ,0xef,"(!GetIsShadowed())","!GetIsShadowed()");
    if (!bVar2) goto LAB_00c2dbe4;
    *puVar5 = 0;
    FVar3 = this->flags;
  }
  this->flags = FVar3 | IsShadowed;
  if ((FVar3 & IsAccessor) == None) {
    if (addingLetConstGlobal) {
      this->Getter = this->Data;
      goto LAB_00c2db56;
    }
    uVar4 = ::Math::PostInc<unsigned_short>(nextPropertyIndex);
    this->Getter = uVar4;
LAB_00c2db7c:
    this->Attributes = this->Attributes | 0x10;
    uVar4 = GetDataPropertyIndex<false>(this);
  }
  else {
    if (this->Data != 0xffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                  ,0xf3,"(this->Data == NoSlots)","this->Data == NoSlots");
      if (!bVar2) goto LAB_00c2dbe4;
      *puVar5 = 0;
    }
    if (!addingLetConstGlobal) goto LAB_00c2db7c;
LAB_00c2db56:
    uVar4 = ::Math::PostInc<unsigned_short>(nextPropertyIndex);
    this->Data = uVar4;
    this->Attributes = this->Attributes | 0x10;
    uVar4 = GetDataPropertyIndex<true>(this);
  }
  if (uVar4 == 0xffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                ,0x103,
                                "((addingLetConstGlobal ? GetDataPropertyIndex<true>() : GetDataPropertyIndex<false>()) != NoSlots)"
                                ,
                                "(addingLetConstGlobal ? GetDataPropertyIndex<true>() : GetDataPropertyIndex<false>()) != NoSlots"
                               );
    if (!bVar2) {
LAB_00c2dbe4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void DictionaryPropertyDescriptor<TPropertyIndex>::AddShadowedData(TPropertyIndex& nextPropertyIndex, bool addingLetConstGlobal)
    {
        Assert(!GetIsShadowed());
        SetIsShadowed(true);
        if (GetIsAccessor())
        {
            Assert(this->Data == NoSlots);
            if (addingLetConstGlobal)
            {
                this->Data = ::Math::PostInc(nextPropertyIndex);
            }
        }
        else if (addingLetConstGlobal)
        {
            this->Getter = this->Data;
            this->Data = ::Math::PostInc(nextPropertyIndex);
        }
        else
        {
            this->Getter = ::Math::PostInc(nextPropertyIndex);
        }
        this->Attributes |= PropertyLetConstGlobal;
        Assert((addingLetConstGlobal ? GetDataPropertyIndex<true>() : GetDataPropertyIndex<false>()) != NoSlots);
    }